

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_case21.c
# Opt level: O3

double cbspline(double u,int ider,hyb_gga_xc_case21_params *params)

{
  long lVar1;
  double dVar2;
  double temp [5];
  double local_58 [5];
  
  if (params->Nsp < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      xc_bspline((int)lVar1,params->k,u,ider,params->knots,local_58);
      dVar2 = dVar2 + params->cc[lVar1] * local_58[(uint)ider];
      lVar1 = lVar1 + 1;
    } while (lVar1 < params->Nsp);
  }
  return dVar2;
}

Assistant:

GPU_DEVICE_FUNCTION static double cbspline(double u, int ider, const hyb_gga_xc_case21_params * params) {
  assert(ider<=4);

  double result=0.0;
  double temp[5]; /* dimension ider+1 */
  for(int i=0;i<params->Nsp;i++) {
    xc_bspline(i, params->k, u, ider, params->knots, temp);
    result += params->cc[i]*temp[ider];
  }
  //printf("cbspline %i %e = % e\n",ider,u,result);
  return result;
}